

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O2

BrInstr * __thiscall
flow::IRBuilder::insert<flow::BrInstr,flow::BasicBlock*&>(IRBuilder *this,BasicBlock **args)

{
  Instr *pIVar1;
  BasicBlock *local_20;
  _Head_base<0UL,_flow::Instr_*,_false> local_18;
  
  std::make_unique<flow::BrInstr,flow::BasicBlock*>(&local_20);
  local_18._M_head_impl = (Instr *)local_20;
  local_20 = (BasicBlock *)0x0;
  pIVar1 = insert(this,(unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)&local_18);
  if ((BasicBlock *)local_18._M_head_impl != (BasicBlock *)0x0) {
    (*((local_18._M_head_impl)->super_Value)._vptr_Value[1])();
  }
  if (local_20 != (BasicBlock *)0x0) {
    (*(local_20->super_Value)._vptr_Value[1])();
  }
  return (BrInstr *)pIVar1;
}

Assistant:

T* insert(Args&&... args) {
    return static_cast<T*>(insert(std::make_unique<T>(std::move(args)...)));
  }